

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O1

void __thiscall QWidgetPrivate::setWindowFlags(QWidgetPrivate *this,WindowFlags flags)

{
  QFlagsStorageHelper<Qt::WindowType,_4> QVar1;
  uint uVar2;
  QWidget *this_00;
  long lVar3;
  QWidgetPrivate *d;
  uint uVar4;
  long in_FS_OFFSET;
  QPoint oldPos;
  QPoint local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&this->field_0x8;
  QVar1.super_QFlagsStorage<Qt::WindowType>.i =
       (QFlagsStorage<Qt::WindowType>)
       (this_00->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
       super_QFlagsStorage<Qt::WindowType>.i;
  if (QVar1.super_QFlagsStorage<Qt::WindowType>.i !=
      (QFlagsStorage<Qt::WindowType>)
      flags.super_QFlagsStorageHelper<Qt::WindowType,_4>.super_QFlagsStorage<Qt::WindowType>.i) {
    if ((((uint)QVar1.super_QFlagsStorage<Qt::WindowType>.i |
         (uint)flags.super_QFlagsStorageHelper<Qt::WindowType,_4>.
               super_QFlagsStorage<Qt::WindowType>.i) & 1) == 0) {
      (this_00->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
      super_QFlagsStorage<Qt::WindowType>.i =
           (Int)flags.super_QFlagsStorageHelper<Qt::WindowType,_4>.
                super_QFlagsStorage<Qt::WindowType>.i;
    }
    else {
      local_38 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
      local_38 = QWidget::pos(this_00);
      uVar2 = this_00->data->widget_attributes;
      uVar4 = (this_00->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
              super_QFlagsStorage<Qt::WindowType>.i;
      QWidget::setParent(this_00,*(QWidget **)(*(long *)&this_00->field_0x8 + 0x10),flags);
      if ((((uVar4 ^ (uint)flags.super_QFlagsStorageHelper<Qt::WindowType,_4>.
                           super_QFlagsStorage<Qt::WindowType>.i) & 1) == 0) &&
         (((short)uVar2 < 0 || ((*(byte *)(*(long *)&this_00->field_0x8 + 0x241) & 8) != 0)))) {
        QWidget::move(this_00,&local_38);
      }
      lVar3 = *(long *)(*(long *)&this->field_0x8 + 8);
      if (*(long *)(lVar3 + 0x10) == 0) {
        uVar4 = (uint)*(byte *)(*(long *)(*(long *)&this->field_0x8 + 0x20) + 0xc);
        if ((0x12 < uVar4) || ((0x4000bU >> (uVar4 & 0x1f) & 1) == 0)) {
          if ((*(uint *)(lVar3 + 0x244) >> 0xc & 1) != 0) {
            *(uint *)(lVar3 + 0x244) = *(uint *)(lVar3 + 0x244) & 0xffffefff;
          }
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetPrivate::setWindowFlags(Qt::WindowFlags flags)
{
    Q_Q(QWidget);
    if (q->data->window_flags == flags)
        return;

    if ((q->data->window_flags | flags) & Qt::Window) {
        // the old type was a window and/or the new type is a window
        QPoint oldPos = q->pos();
        bool visible = q->isVisible();
        const bool windowFlagChanged = (q->data->window_flags ^ flags) & Qt::Window;
        q->setParent(q->parentWidget(), flags);

        // if both types are windows or neither of them are, we restore
        // the old position
        if (!windowFlagChanged && (visible || q->testAttribute(Qt::WA_Moved)))
            q->move(oldPos);
        // for backward-compatibility we change Qt::WA_QuitOnClose attribute value only when the window was recreated.
        adjustQuitOnCloseAttribute();
    } else {
        q->data->window_flags = flags;
    }
}